

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbopacking32.h
# Opt level: O1

void unpackforblock18(uint32_t base,uint8_t **pw,uint32_t **pout)

{
  ulong *puVar1;
  uint32_t *puVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  
  puVar1 = (ulong *)*pw;
  puVar2 = *pout;
  uVar3 = *puVar1;
  uVar4 = puVar1[1];
  uVar5 = puVar1[2];
  uVar6 = puVar1[3];
  uVar7 = puVar1[4];
  uVar8 = puVar1[5];
  uVar9 = puVar1[6];
  uVar10 = puVar1[7];
  uVar11 = puVar1[8];
  *pw = (uint8_t *)(puVar1 + 9);
  *puVar2 = ((uint)uVar3 & 0x3ffff) + base;
  uVar12 = (uint)(uVar3 >> 0x20);
  puVar2[1] = ((uint)(uVar3 >> 0x12) & 0x3ffff) + base;
  puVar2[2] = (uVar12 >> 4 & 0x3ffff) + base;
  puVar2[3] = ((uint)(uVar4 << 10) & 0x3ffff | uVar12 >> 0x16) + base;
  puVar2[4] = ((uint)(uVar4 >> 8) & 0x3ffff) + base;
  uVar12 = (uint)(uVar4 >> 0x20);
  puVar2[5] = ((uint)(uVar4 >> 0x1a) & 0x3ffff) + base;
  puVar2[6] = (uVar12 >> 0xc & 0x3ffff) + base;
  puVar2[7] = ((uint)(uVar5 << 2) & 0x3ffff | uVar12 >> 0x1e) + base;
  puVar2[8] = ((uint)(uVar5 >> 0x10) & 0x3ffff) + base;
  uVar12 = (uint)(uVar5 >> 0x20);
  puVar2[9] = (uVar12 >> 2 & 0x3ffff) + base;
  puVar2[10] = ((uint)(uVar6 << 0xc) & 0x3ffff | uVar12 >> 0x14) + base;
  puVar2[0xb] = ((uint)(uVar6 >> 6) & 0x3ffff) + base;
  puVar2[0xc] = ((uint)(uVar6 >> 0x18) & 0x3ffff) + base;
  uVar12 = (uint)(uVar6 >> 0x20);
  puVar2[0xd] = (uVar12 >> 10 & 0x3ffff) + base;
  puVar2[0xe] = ((uint)(uVar7 << 4) & 0x3ffff | uVar12 >> 0x1c) + base;
  puVar2[0xf] = ((uint)(uVar7 >> 0xe) & 0x3ffff) + base;
  uVar12 = (uint)(uVar7 >> 0x20);
  puVar2[0x10] = (uVar12 & 0x3ffff) + base;
  puVar2[0x11] = ((uint)(uVar8 << 0xe) & 0x3ffff | uVar12 >> 0x12) + base;
  puVar2[0x12] = ((uint)(uVar8 >> 4) & 0x3ffff) + base;
  puVar2[0x13] = ((uint)(uVar8 >> 0x16) & 0x3ffff) + base;
  uVar12 = (uint)(uVar8 >> 0x20);
  puVar2[0x14] = (uVar12 >> 8 & 0x3ffff) + base;
  puVar2[0x15] = ((uint)(uVar9 << 6) & 0x3ffff | uVar12 >> 0x1a) + base;
  puVar2[0x16] = ((uint)(uVar9 >> 0xc) & 0x3ffff) + base;
  puVar2[0x17] = ((uint)(uVar9 >> 0x1e) & 0x3ffff) + base;
  puVar2[0x18] = ((uint)(uVar10 << 0x10) & 0x3ffff | (uint)(ushort)(uVar9 >> 0x30)) + base;
  puVar2[0x19] = ((uint)(uVar10 >> 2) & 0x3ffff) + base;
  puVar2[0x1a] = ((uint)(uVar10 >> 0x14) & 0x3ffff) + base;
  puVar2[0x1b] = ((uint)(uVar10 >> 0x26) & 0x3ffff) + base;
  puVar2[0x1c] = ((uint)(uVar11 << 8) & 0x3ffff | (uint)(byte)(uVar10 >> 0x38)) + base;
  puVar2[0x1d] = ((uint)(uVar11 >> 10) & 0x3ffff) + base;
  puVar2[0x1e] = ((uint)(uVar11 >> 0x1c) & 0x3ffff) + base;
  puVar2[0x1f] = (uint)(uVar11 >> 0x2e) + base;
  *pout = *pout + 0x20;
  return;
}

Assistant:

static void unpackforblock18(const uint32_t base, const uint8_t **pw,
                             uint32_t **pout) {
  const uint64_t *pw64 = *(const uint64_t **)pw;
  uint32_t *out = *pout;
  const uint64_t mask = UINT64_C(262143);
  /* we are going to access  9 64-bit words */
  uint64_t w0 = pw64[0];
  uint64_t w1 = pw64[1];
  uint64_t w2 = pw64[2];
  uint64_t w3 = pw64[3];
  uint64_t w4 = pw64[4];
  uint64_t w5 = pw64[5];
  uint64_t w6 = pw64[6];
  uint64_t w7 = pw64[7];
  uint64_t w8 = pw64[8];
  *pw += 72; /* we used up 72 input bytes */
  out[0] = base + (uint32_t)((w0)&mask);
  out[1] = base + (uint32_t)((w0 >> 18) & mask);
  out[2] = base + (uint32_t)((w0 >> 36) & mask);
  out[3] = base + (uint32_t)(((w0 >> 54) | (w1 << 10)) & mask);
  out[4] = base + (uint32_t)((w1 >> 8) & mask);
  out[5] = base + (uint32_t)((w1 >> 26) & mask);
  out[6] = base + (uint32_t)((w1 >> 44) & mask);
  out[7] = base + (uint32_t)(((w1 >> 62) | (w2 << 2)) & mask);
  out[8] = base + (uint32_t)((w2 >> 16) & mask);
  out[9] = base + (uint32_t)((w2 >> 34) & mask);
  out[10] = base + (uint32_t)(((w2 >> 52) | (w3 << 12)) & mask);
  out[11] = base + (uint32_t)((w3 >> 6) & mask);
  out[12] = base + (uint32_t)((w3 >> 24) & mask);
  out[13] = base + (uint32_t)((w3 >> 42) & mask);
  out[14] = base + (uint32_t)(((w3 >> 60) | (w4 << 4)) & mask);
  out[15] = base + (uint32_t)((w4 >> 14) & mask);
  out[16] = base + (uint32_t)((w4 >> 32) & mask);
  out[17] = base + (uint32_t)(((w4 >> 50) | (w5 << 14)) & mask);
  out[18] = base + (uint32_t)((w5 >> 4) & mask);
  out[19] = base + (uint32_t)((w5 >> 22) & mask);
  out[20] = base + (uint32_t)((w5 >> 40) & mask);
  out[21] = base + (uint32_t)(((w5 >> 58) | (w6 << 6)) & mask);
  out[22] = base + (uint32_t)((w6 >> 12) & mask);
  out[23] = base + (uint32_t)((w6 >> 30) & mask);
  out[24] = base + (uint32_t)(((w6 >> 48) | (w7 << 16)) & mask);
  out[25] = base + (uint32_t)((w7 >> 2) & mask);
  out[26] = base + (uint32_t)((w7 >> 20) & mask);
  out[27] = base + (uint32_t)((w7 >> 38) & mask);
  out[28] = base + (uint32_t)(((w7 >> 56) | (w8 << 8)) & mask);
  out[29] = base + (uint32_t)((w8 >> 10) & mask);
  out[30] = base + (uint32_t)((w8 >> 28) & mask);
  out[31] = base + (uint32_t)(w8 >> 46);
  *pout += 32; /* we wrote 32 32-bit integers */
}